

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

bool __thiscall QUrl::isParentOf(QUrl *this,QUrl *childUrl)

{
  int iVar1;
  QUrlPrivate *pQVar2;
  long lVar3;
  QUrlPrivate *pQVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char16_t *pcVar8;
  QArrayData *pQVar9;
  qsizetype qVar10;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  QArrayData *local_c8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  path(&local_58,childUrl,(ComponentFormattingOptions)0x7f00000);
  if (this->d == (QUrlPrivate *)0x0) {
    pQVar2 = childUrl->d;
    if (pQVar2 == (QUrlPrivate *)0x0) {
      pQVar9 = (QArrayData *)0x0;
LAB_0025e4a4:
      authority(&local_78,childUrl,(ComponentFormattingOptions)0x0);
      if (((undefined1 *)local_78.d.size == (undefined1 *)0x0) &&
         ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) {
        bVar6 = *local_58.d.ptr == L'/';
      }
      else {
        bVar6 = false;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      pQVar9 = &((pQVar2->scheme).d.d)->super_QArrayData;
      lVar3 = (pQVar2->scheme).d.size;
      if (pQVar9 != (QArrayData *)0x0) {
        LOCK();
        (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar3 == 0) goto LAB_0025e4a4;
      bVar6 = false;
    }
    if (pQVar9 == (QArrayData *)0x0) goto LAB_0025e5a9;
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    path(&local_78,this,(ComponentFormattingOptions)0x7f00000);
    pQVar2 = childUrl->d;
    bVar5 = true;
    if (pQVar2 == (QUrlPrivate *)0x0) {
      pQVar9 = (QArrayData *)0x0;
LAB_0025e351:
      authority(&local_90,childUrl,(ComponentFormattingOptions)0x0);
      if (local_90.d.size == 0) {
LAB_0025e3ae:
        bVar6 = QString::startsWith(&local_58,&local_78,CaseSensitive);
        if (bVar6) {
          bVar6 = QString::endsWith(&local_78,(QChar)0x2f,CaseSensitive);
          if ((!bVar6) || (bVar6 = true, (ulong)local_58.d.size <= (ulong)local_78.d.size)) {
            bVar6 = QString::endsWith(&local_78,(QChar)0x2f,CaseSensitive);
            if ((bVar6) || ((ulong)local_58.d.size <= (ulong)local_78.d.size)) goto LAB_0025e42b;
            bVar6 = local_58.d.ptr[local_78.d.size] == L'/';
          }
        }
        else {
LAB_0025e42b:
          bVar6 = false;
        }
        if (local_90.d.size != 0) goto LAB_0025e432;
      }
      else {
        authority(&local_a8,this,(ComponentFormattingOptions)0x0);
        authority(&local_c0,childUrl,(ComponentFormattingOptions)0x0);
        if ((local_a8.d.size == local_c0.d.size) &&
           (rhs.m_data = local_c0.d.ptr, rhs.m_size = local_a8.d.size, lhs.m_data = local_a8.d.ptr,
           lhs.m_size = local_a8.d.size, bVar6 = QtPrivate::equalStrings(lhs,rhs), bVar6))
        goto LAB_0025e3ae;
        bVar6 = false;
LAB_0025e432:
        if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (!bVar5) goto LAB_0025e4f5;
    }
    else {
      pQVar9 = &((pQVar2->scheme).d.d)->super_QArrayData;
      lVar3 = (pQVar2->scheme).d.size;
      if (pQVar9 != (QArrayData *)0x0) {
        LOCK();
        (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar3 == 0) goto LAB_0025e351;
      pQVar2 = this->d;
      pQVar4 = childUrl->d;
      if (pQVar4 == (QUrlPrivate *)0x0) {
        pcVar8 = (char16_t *)0x0;
        qVar10 = 0;
LAB_0025e4ca:
        local_c8 = (QArrayData *)0x0;
      }
      else {
        local_c8 = &((pQVar4->scheme).d.d)->super_QArrayData;
        pcVar8 = (pQVar4->scheme).d.ptr;
        qVar10 = (pQVar4->scheme).d.size;
        if (local_c8 == (QArrayData *)0x0) goto LAB_0025e4ca;
        LOCK();
        (((QArrayData *)&local_c8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_c8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((pQVar2->scheme).d.size == qVar10) {
        rhs_00.m_data = pcVar8;
        rhs_00.m_size = qVar10;
        lhs_00.m_data = (pQVar2->scheme).d.ptr;
        lhs_00.m_size = qVar10;
        bVar7 = QtPrivate::equalStrings(lhs_00,rhs_00);
        bVar5 = false;
        bVar6 = false;
        if (bVar7) goto LAB_0025e351;
      }
      else {
        bVar6 = false;
      }
LAB_0025e4f5:
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,2,0x10);
        }
      }
    }
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0025e5a9;
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar9 = &(local_78.d.d)->super_QArrayData;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(pQVar9,2,0x10);
  }
LAB_0025e5a9:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QUrl::isParentOf(const QUrl &childUrl) const
{
    QString childPath = childUrl.path();

    if (!d)
        return ((childUrl.scheme().isEmpty())
            && (childUrl.authority().isEmpty())
            && childPath.size() > 0 && childPath.at(0) == u'/');

    QString ourPath = path();

    return ((childUrl.scheme().isEmpty() || d->scheme == childUrl.scheme())
            && (childUrl.authority().isEmpty() || authority() == childUrl.authority())
            &&  childPath.startsWith(ourPath)
            && ((ourPath.endsWith(u'/') && childPath.size() > ourPath.size())
                || (!ourPath.endsWith(u'/') && childPath.size() > ourPath.size()
                    && childPath.at(ourPath.size()) == u'/')));
}